

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterDcStatAccess.cpp
# Opt level: O1

long __thiscall
bhf::ads::MasterDcStatAccess::RunCommand
          (MasterDcStatAccess *this,ECADS_IOFFS_MASTER_DC_STAT command)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dcDiagNames;
  stringstream stream;
  allocator_type local_1fd;
  ECADS_IOFFS_MASTER_DC_STAT local_1fc;
  string local_1f8;
  _Rb_tree<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  ostream local_198 [8];
  char local_190 [16];
  undefined4 local_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined4 local_158;
  undefined1 *local_150 [2];
  undefined1 local_140 [24];
  ios_base local_128 [264];
  
  local_1a8._0_4_ = ACTIVATE;
  local_1a0._M_p = local_190;
  local_1fc = command;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Activating","");
  local_180 = 0;
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Clearing","");
  local_158 = 2;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Deactivating","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_1a8;
  std::
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_1d8,__l,(less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT> *)&local_1f8,&local_1fd);
  lVar3 = 0;
  do {
    if (local_140 + lVar3 != *(undefined1 **)((long)local_150 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_150 + lVar3));
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x78);
  lVar3 = AdsDevice::WriteReqEx(&this->device,0x2f,local_1fc,0,(void *)0x0);
  if (lVar3 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    pmVar1 = std::
             map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_1d8,&local_1fc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(pmVar1->_M_dataplus)._M_p,pmVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," DC diagnosis failed with 0x",0x1c);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long>((long)poVar2);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  std::
  _Rb_tree<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  return lVar3;
}

Assistant:

long MasterDcStatAccess::RunCommand(ECADS_IOFFS_MASTER_DC_STAT command) const
{
    const std::map<ECADS_IOFFS_MASTER_DC_STAT, std::string> dcDiagNames = {
        { ECADS_IOFFS_MASTER_DC_STAT::ACTIVATE, "Activating" },
        { ECADS_IOFFS_MASTER_DC_STAT::CLEAR, "Clearing" },
        { ECADS_IOFFS_MASTER_DC_STAT::DEACTIVATE, "Deactivating" },
    };

    const auto status = device.WriteReqEx(
        ECADS_IGRP_MASTER_DC_STAT,
        command,
        0,
        nullptr
        );

    if (status != ADSERR_NOERR) {
        LOG_ERROR(dcDiagNames.at(command) << " DC diagnosis failed with 0x" << std::hex << status);
        return status;
    }

    return status;
}